

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

LongLong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryAvailable
          (SystemInformationImplementation *this,char *hostLimitEnvVarName)

{
  int iVar1;
  char *__nptr;
  ulong uVar2;
  ulong uVar3;
  longlong values [1];
  char *fieldNames [2];
  ulong local_30;
  char *local_28;
  undefined8 local_20;
  
  local_28 = "MemTotal:";
  local_20 = 0;
  local_30 = 0;
  iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                    ("/proc/meminfo",&local_28,(longlong *)&local_30);
  uVar3 = -(ulong)(iVar1 != 0) | local_30;
  if (hostLimitEnvVarName != (char *)0x0) {
    __nptr = getenv(hostLimitEnvVarName);
    if (__nptr != (char *)0x0) {
      uVar2 = atoll(__nptr);
      if ((0 < (long)uVar2) && ((long)uVar2 < (long)uVar3)) {
        uVar3 = uVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetHostMemoryAvailable(const char *hostLimitEnvVarName)
{
  SystemInformation::LongLong memTotal=this->GetHostMemoryTotal();

  // the following mechanism is provided for systems that
  // apply resource limits across groups of processes.
  // this is of use on certain SMP systems (eg. SGI UV)
  // where the host has a large amount of ram but a given user's
  // access to it is severly restricted. The system will
  // apply a limit across a set of processes. Units are in KiB.
  if (hostLimitEnvVarName)
    {
    const char *hostLimitEnvVarValue=getenv(hostLimitEnvVarName);
    if (hostLimitEnvVarValue)
      {
      SystemInformation::LongLong hostLimit=atoLongLong(hostLimitEnvVarValue);
      if (hostLimit>0)
        {
        memTotal=min(hostLimit,memTotal);
        }
      }
    }

  return memTotal;
}